

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O0

void __thiscall
tvm::runtime::TVMRetValue::SwitchToClass<tvm::runtime::PackedFunc>
          (TVMRetValue *this,int type_code,PackedFunc *v)

{
  PackedFunc *this_00;
  PackedFunc *v_local;
  int type_code_local;
  TVMRetValue *this_local;
  
  if ((this->super_TVMPODValue_).type_code_ == type_code) {
    PackedFunc::operator=((PackedFunc *)(this->super_TVMPODValue_).value_.v_handle,v);
  }
  else {
    Clear(this);
    (this->super_TVMPODValue_).type_code_ = type_code;
    this_00 = (PackedFunc *)operator_new(0x20);
    PackedFunc::PackedFunc(this_00,v);
    (this->super_TVMPODValue_).value_.v_handle = this_00;
  }
  return;
}

Assistant:

void SwitchToClass(int type_code, T v) {
    if (type_code_ != type_code) {
      this->Clear();
      type_code_ = type_code;
      value_.v_handle = new T(v);
    } else {
      *static_cast<T *>(value_.v_handle) = v;
    }
  }